

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::String::EndsWithCaseInsensitive(string *str,string *suffix)

{
  bool bVar1;
  
  if (str->_M_string_length < suffix->_M_string_length) {
    return false;
  }
  bVar1 = CaseInsensitiveCStringEquals
                    ((str->_M_dataplus)._M_p + (str->_M_string_length - suffix->_M_string_length),
                     (suffix->_M_dataplus)._M_p);
  return bVar1;
}

Assistant:

bool String::EndsWithCaseInsensitive(const std::string& str,
                                     const std::string& suffix) {
  const size_t str_len = str.length();
  const size_t suffix_len = suffix.length();
  return (str_len >= suffix_len) &&
         CaseInsensitiveCStringEquals(str.c_str() + str_len - suffix_len,
                                      suffix.c_str());
}